

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::c_formatter::format
          (c_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  char *pcVar1;
  fmt_helper *pfVar2;
  undefined1 *puVar3;
  string_view_t view;
  string_view_t view_00;
  char local_41;
  scoped_pad p;
  
  scoped_pad::scoped_pad(&p,0x18,&(this->super_flag_formatter).padinfo_,dest);
  puVar3 = days;
  pcVar1 = *(char **)(days + (long)tm_time->tm_wday * 8);
  pfVar2 = (fmt_helper *)strlen(pcVar1);
  view._M_str = (char *)dest;
  view._M_len = (size_t)pcVar1;
  fmt_helper::append_string_view<500ul>
            (pfVar2,view,(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)puVar3);
  local_41 = ' ';
  ::fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  puVar3 = months;
  pcVar1 = *(char **)(months + (long)tm_time->tm_mon * 8);
  pfVar2 = (fmt_helper *)strlen(pcVar1);
  view_00._M_str = (char *)dest;
  view_00._M_len = (size_t)pcVar1;
  fmt_helper::append_string_view<500ul>
            (pfVar2,view_00,(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)puVar3);
  local_41 = ' ';
  ::fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  fmt_helper::append_int<int,500ul>(tm_time->tm_mday,dest);
  local_41 = ' ';
  ::fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  fmt_helper::pad2<500ul>(tm_time->tm_hour,dest);
  local_41 = ':';
  ::fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  fmt_helper::pad2<500ul>(tm_time->tm_min,dest);
  local_41 = ':';
  ::fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  fmt_helper::pad2<500ul>(tm_time->tm_sec,dest);
  local_41 = ' ';
  ::fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  fmt_helper::append_int<int,500ul>(tm_time->tm_year + 0x76c,dest);
  scoped_pad::~scoped_pad(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 24;
        scoped_pad p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[tm_time.tm_wday], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[tm_time.tm_mon], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }